

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void fscope_begin(FuncState *fs,FuncScope *bl,int flags)

{
  int flags_local;
  FuncScope *bl_local;
  FuncState *fs_local;
  
  bl->nactvar = (uint8_t)fs->nactvar;
  bl->flags = (uint8_t)flags;
  bl->vstart = fs->ls->vtop;
  bl->prev = fs->bl;
  fs->bl = bl;
  return;
}

Assistant:

static void fscope_begin(FuncState *fs, FuncScope *bl, int flags)
{
  bl->nactvar = (uint8_t)fs->nactvar;
  bl->flags = flags;
  bl->vstart = fs->ls->vtop;
  bl->prev = fs->bl;
  fs->bl = bl;
  lj_assertFS(fs->freereg == fs->nactvar, "bad regalloc");
}